

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

bool __thiscall Rml::Element::SetProperty(Element *this,String *name,String *value)

{
  NodePtr pDVar1;
  bool bVar2;
  bool bVar3;
  PropertyMap *this_00;
  const_iterator __begin1;
  PropertyDictionary properties;
  
  PropertyDictionary::PropertyDictionary(&properties);
  bVar2 = StyleSheetSpecification::ParsePropertyDeclaration(&properties,name,value);
  if (bVar2) {
    this_00 = PropertyDictionary::GetProperties(&properties);
    __begin1 = robin_hood::detail::
               Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
               ::cbegin(this_00);
    pDVar1 = (NodePtr)this_00->mInfo;
    while (bVar2 = __begin1.mKeyVals == pDVar1, !bVar2) {
      bVar3 = ElementStyle::SetProperty
                        (&this->meta->style,((__begin1.mKeyVals)->mData).first,
                         &((__begin1.mKeyVals)->mData).second);
      if (!bVar3) break;
      robin_hood::detail::
      Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
      ::Iter<true>::operator++(&__begin1);
    }
  }
  else {
    bVar2 = false;
    Log::Message(LT_WARNING,"Syntax error parsing inline property declaration \'%s: %s;\'.",
                 (name->_M_dataplus)._M_p,(value->_M_dataplus)._M_p);
  }
  robin_hood::detail::
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  ::destroy(&properties.properties);
  return bVar2;
}

Assistant:

bool Element::SetProperty(const String& name, const String& value)
{
	// The name may be a shorthand giving us multiple underlying properties
	PropertyDictionary properties;
	if (!StyleSheetSpecification::ParsePropertyDeclaration(properties, name, value))
	{
		Log::Message(Log::LT_WARNING, "Syntax error parsing inline property declaration '%s: %s;'.", name.c_str(), value.c_str());
		return false;
	}
	for (auto& property : properties.GetProperties())
	{
		if (!meta->style.SetProperty(property.first, property.second))
			return false;
	}
	return true;
}